

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadBoundThreadContextManager.cpp
# Opt level: O0

void ThreadBoundThreadContextManager::DestroyAllContextsAndEntries(bool shouldDeleteCurrentTlsEntry)

{
  ThreadContextTLSEntry *this;
  bool bVar1;
  CriticalSection *cs;
  ThreadContextTLSEntry **ppTVar2;
  ThreadContext *threadContext_00;
  ThreadContextTLSEntry *local_48;
  ThreadContext *threadContext;
  ThreadContextTLSEntry *entry;
  ThreadContextTLSEntry *currentThreadEntry;
  AutoCriticalSection lock;
  bool shouldDeleteCurrentTlsEntry_local;
  
  lock.cs._7_1_ = shouldDeleteCurrentTlsEntry;
  BGParseManager::DeleteBGParseManager();
  cs = ThreadContext::GetCriticalSection();
  AutoCriticalSection::AutoCriticalSection((AutoCriticalSection *)&currentThreadEntry,cs);
  if ((lock.cs._7_1_ & 1) == 0) {
    local_48 = ThreadContextTLSEntry::GetEntryForCurrentThread();
  }
  else {
    local_48 = (ThreadContextTLSEntry *)0x0;
  }
  while (bVar1 = DListBase<ThreadContextTLSEntry_*,_RealCount>::Empty
                           (&entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    ppTVar2 = DListBase<ThreadContextTLSEntry_*,_RealCount>::Head
                        (&entries.super_DListBase<ThreadContextTLSEntry_*,_RealCount>);
    this = *ppTVar2;
    threadContext_00 = ThreadContextTLSEntry::GetThreadContext(this);
    DList<ThreadContextTLSEntry_*,_Memory::HeapAllocator,_RealCount>::RemoveHead(&entries);
    if (threadContext_00 != (ThreadContext *)0x0) {
      ThreadContextManagerBase::ShutdownThreadContext(threadContext_00,true);
    }
    if (local_48 != this) {
      ThreadContextTLSEntry::Delete(this);
    }
  }
  if (s_sharedJobProcessor != (BackgroundJobProcessor *)0x0) {
    JsUtil::BackgroundJobProcessor::Close(s_sharedJobProcessor);
    Memory::
    DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,JsUtil::BackgroundJobProcessor>
              (&Memory::HeapAllocator::Instance,s_sharedJobProcessor);
    s_sharedJobProcessor = (BackgroundJobProcessor *)0x0;
  }
  AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&currentThreadEntry);
  return;
}

Assistant:

void ThreadBoundThreadContextManager::DestroyAllContextsAndEntries(bool shouldDeleteCurrentTlsEntry)
{
    // Since BGParseManager has a dependency on threadcontexts, make sure it shuts down first
    BGParseManager::DeleteBGParseManager();

    AutoCriticalSection lock(ThreadContext::GetCriticalSection());

    // When shouldDeleteCurrentTlsEntry is true, the comparison in the while loop will always be true, so
    // every entry in the list will be deleted.
    ThreadContextTLSEntry* currentThreadEntry = shouldDeleteCurrentTlsEntry ? nullptr : ThreadContextTLSEntry::GetEntryForCurrentThread();

    while (!entries.Empty())
    {
        ThreadContextTLSEntry * entry = entries.Head();
        ThreadContext * threadContext =  static_cast<ThreadContext *>(entry->GetThreadContext());

        entries.RemoveHead();

        if (threadContext != nullptr)
        {
            ShutdownThreadContext(threadContext);
        }

        if (currentThreadEntry != entry)
        {
            // Note: This deletes the ThreadContextTLSEntry but does not remove its pointer
            // from the thread's TLS
            ThreadContextTLSEntry::Delete(entry);
        }
    }

#if ENABLE_BACKGROUND_JOB_PROCESSOR
    if (s_sharedJobProcessor != NULL)
    {
        s_sharedJobProcessor->Close();

        HeapDelete(s_sharedJobProcessor);
        s_sharedJobProcessor = NULL;
    }
#endif
}